

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack15(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  
  uVar1 = in[2];
  *out = (uint)uVar1 << 0x1e | ((uint)in[1] & 0x7fff) << 0xf | (uint)*in & 0x7fff;
  out[1] = (uint)uVar1 >> 2 & 0x1fff;
  Unroller<(unsigned_short)15,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack15(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<15>::Pack(in, out);
}